

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

Leaf * __thiscall
SuffixTree::GeneralizedSuffixTree::AllocLeaf
          (GeneralizedSuffixTree *this,Node *parent,uint string_number)

{
  uint uVar1;
  char *pcVar2;
  size_type sVar3;
  uint string_number_local;
  Node *parent_local;
  GeneralizedSuffixTree *this_local;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->strings);
  if (string_number < sVar3) {
    pcVar2 = this->leaves;
    uVar1 = this->leaves_num;
    this->leaves_num = uVar1 + 1;
    Leaf::Leaf((Leaf *)(pcVar2 + (ulong)uVar1 * 0x10),parent,string_number);
    return (Leaf *)(pcVar2 + (ulong)uVar1 * 0x10);
  }
  __assert_fail("string_number < strings.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                ,0xd6,"Leaf *SuffixTree::GeneralizedSuffixTree::AllocLeaf(Node *, uint)");
}

Assistant:

Leaf *GeneralizedSuffixTree::AllocLeaf (Node *parent, uint string_number)
{
    assert (string_number < strings.size());
	return new (leaves + (leaves_num++) * sizeof (Leaf)) Leaf (parent, string_number);
}